

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaTargetGenerator::EmitSwiftDependencyInfo(cmNinjaTargetGenerator *this,cmSourceFile *source)

{
  undefined1 *puVar1;
  cmLocalNinjaGenerator *pcVar2;
  cmMakefile *this_00;
  ValueHolder VVar3;
  bool bVar4;
  char *pcVar5;
  Value *pVVar6;
  Value entry;
  string objectFileDir;
  string dependFileName;
  string local_1d0;
  string objectFilePath;
  string makeDepsPath;
  string swiftDiaPath;
  string swiftDepsPath;
  string sourceFilePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  Value local_f0;
  Value local_c8;
  Value local_a0;
  Value local_78;
  Value local_50;
  
  GetSourceFilePath_abi_cxx11_((string *)&entry,this,source);
  ConvertToNinjaPath(&sourceFilePath,this,(string *)&entry);
  std::__cxx11::string::~string((string *)&entry);
  GetObjectFilePath_abi_cxx11_((string *)&entry,this,source);
  ConvertToNinjaPath(&objectFilePath,this,(string *)&entry);
  std::__cxx11::string::~string((string *)&entry);
  puVar1 = &entry.field_0x8;
  entry.value_ = (ValueHolder)source;
  std::__cxx11::string::string((string *)puVar1,(string *)&objectFilePath);
  VVar3 = entry.value_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&objectFileDir,"Swift_DEPENDENCIES_FILE",(allocator<char> *)&dependFileName);
  pcVar5 = cmSourceFile::GetProperty(VVar3.string_,&objectFileDir);
  std::__cxx11::string::~string((string *)&objectFileDir);
  if (pcVar5 == (char *)0x0) {
    std::operator+(&swiftDepsPath,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar1,
                   ".swiftdeps");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&swiftDepsPath,pcVar5,(allocator<char> *)&objectFileDir);
  }
  std::__cxx11::string::~string((string *)puVar1);
  puVar1 = &entry.field_0x8;
  entry.value_ = (ValueHolder)source;
  std::__cxx11::string::string((string *)puVar1,(string *)&objectFilePath);
  VVar3 = entry.value_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&objectFileDir,"Swift_DIAGNOSTICS_FILE",(allocator<char> *)&dependFileName);
  pcVar5 = cmSourceFile::GetProperty(VVar3.string_,&objectFileDir);
  std::__cxx11::string::~string((string *)&objectFileDir);
  if (pcVar5 == (char *)0x0) {
    std::operator+(&swiftDiaPath,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar1,
                   ".dia");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&swiftDiaPath,pcVar5,(allocator<char> *)&objectFileDir);
  }
  std::__cxx11::string::~string((string *)puVar1);
  pcVar2 = this->LocalGenerator;
  GetObjectFilePath_abi_cxx11_(&objectFileDir,this,source);
  ConvertToNinjaPath((string *)&entry,this,&objectFileDir);
  std::__cxx11::string::~string((string *)&objectFileDir);
  cmsys::SystemTools::GetFilenamePath(&objectFileDir,(string *)&entry);
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dependFileName,"CMAKE_Swift_DEPFLE_EXTNSION_REPLACE",
             (allocator<char> *)&local_1d0);
  bVar4 = cmMakefile::IsOn(this_00,&dependFileName);
  std::__cxx11::string::~string((string *)&dependFileName);
  if (bVar4) {
    cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1d0,(string *)&entry);
    std::operator+(&dependFileName,&local_1d0,".d");
    std::__cxx11::string::~string((string *)&local_1d0);
    std::operator+(&local_110,&objectFileDir,"/");
    std::operator+(&local_1d0,&local_110,&dependFileName);
    cmOutputConverter::ConvertToOutputFormat
              (&makeDepsPath,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_1d0,SHELL);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_110);
  }
  else {
    std::operator+(&dependFileName,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&entry,".d")
    ;
    cmOutputConverter::ConvertToOutputFormat
              (&makeDepsPath,
               &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&dependFileName,SHELL);
  }
  std::__cxx11::string::~string((string *)&dependFileName);
  std::__cxx11::string::~string((string *)&objectFileDir);
  std::__cxx11::string::~string((string *)&entry);
  Json::Value::Value(&entry,objectValue);
  Json::Value::Value(&local_50,&objectFilePath);
  pVVar6 = Json::Value::operator[](&entry,"object");
  Json::Value::operator=(pVVar6,&local_50);
  Json::Value::~Value(&local_50);
  Json::Value::Value(&local_78,&makeDepsPath);
  pVVar6 = Json::Value::operator[](&entry,"dependencies");
  Json::Value::operator=(pVVar6,&local_78);
  Json::Value::~Value(&local_78);
  Json::Value::Value(&local_a0,&swiftDepsPath);
  pVVar6 = Json::Value::operator[](&entry,"swift-dependencies");
  Json::Value::operator=(pVVar6,&local_a0);
  Json::Value::~Value(&local_a0);
  Json::Value::Value(&local_c8,&swiftDiaPath);
  pVVar6 = Json::Value::operator[](&entry,"diagnostics");
  Json::Value::operator=(pVVar6,&local_c8);
  Json::Value::~Value(&local_c8);
  Json::Value::Value(&local_f0,&entry);
  pVVar6 = Json::Value::operator[](&this->SwiftOutputMap,&sourceFilePath);
  Json::Value::operator=(pVVar6,&local_f0);
  Json::Value::~Value(&local_f0);
  Json::Value::~Value(&entry);
  std::__cxx11::string::~string((string *)&makeDepsPath);
  std::__cxx11::string::~string((string *)&swiftDiaPath);
  std::__cxx11::string::~string((string *)&swiftDepsPath);
  std::__cxx11::string::~string((string *)&objectFilePath);
  std::__cxx11::string::~string((string *)&sourceFilePath);
  return;
}

Assistant:

void cmNinjaTargetGenerator::EmitSwiftDependencyInfo(
  cmSourceFile const* source)
{
  std::string const sourceFilePath =
    this->ConvertToNinjaPath(this->GetSourceFilePath(source));
  std::string const objectFilePath =
    this->ConvertToNinjaPath(this->GetObjectFilePath(source));
  std::string const swiftDepsPath = [source, objectFilePath]() -> std::string {
    if (const char* name = source->GetProperty("Swift_DEPENDENCIES_FILE")) {
      return name;
    }
    return objectFilePath + ".swiftdeps";
  }();
  std::string const swiftDiaPath = [source, objectFilePath]() -> std::string {
    if (const char* name = source->GetProperty("Swift_DIAGNOSTICS_FILE")) {
      return name;
    }
    return objectFilePath + ".dia";
  }();
  std::string const makeDepsPath = [this, source]() -> std::string {
    cmLocalNinjaGenerator const* local = this->GetLocalGenerator();
    std::string const objectFileName =
      this->ConvertToNinjaPath(this->GetObjectFilePath(source));
    std::string const objectFileDir =
      cmSystemTools::GetFilenamePath(objectFileName);

    if (this->Makefile->IsOn("CMAKE_Swift_DEPFLE_EXTNSION_REPLACE")) {
      std::string dependFileName =
        cmSystemTools::GetFilenameWithoutLastExtension(objectFileName) + ".d";
      return local->ConvertToOutputFormat(objectFileDir + "/" + dependFileName,
                                          cmOutputConverter::SHELL);
    }
    return local->ConvertToOutputFormat(objectFileName + ".d",
                                        cmOutputConverter::SHELL);
  }();

  // build the source file mapping
  // https://github.com/apple/swift/blob/master/docs/Driver.md#output-file-maps
  Json::Value entry = Json::Value(Json::objectValue);
  entry["object"] = objectFilePath;
  entry["dependencies"] = makeDepsPath;
  entry["swift-dependencies"] = swiftDepsPath;
  entry["diagnostics"] = swiftDiaPath;
  SwiftOutputMap[sourceFilePath] = entry;
}